

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkproxy.cpp
# Opt level: O0

void __thiscall QGlobalNetworkProxy::~QGlobalNetworkProxy(QGlobalNetworkProxy *this)

{
  void *pvVar1;
  __pointer_type pQVar2;
  long *plVar3;
  QRecursiveMutex *in_RDI;
  
  pvVar1 = in_RDI[1].owner.super_QBasicAtomicPointer<void>._q_value._M_b._M_p;
  if (pvVar1 != (void *)0x0) {
    QNetworkProxy::~QNetworkProxy((QNetworkProxy *)0x24ed20);
    operator_delete(pvVar1,8);
  }
  if (*(long **)&in_RDI[1].count != (long *)0x0) {
    (**(code **)(**(long **)&in_RDI[1].count + 8))();
  }
  pQVar2 = in_RDI[1].mutex.super_QBasicMutex.d_ptr._q_value._M_b._M_p;
  if (pQVar2 != (__pointer_type)0x0) {
    (**(code **)(*(long *)pQVar2 + 8))();
  }
  plVar3 = (long *)in_RDI[2].owner.super_QBasicAtomicPointer<void>._q_value._M_b._M_p;
  if (plVar3 != (long *)0x0) {
    (**(code **)(*plVar3 + 8))();
  }
  QRecursiveMutex::~QRecursiveMutex(in_RDI);
  return;
}

Assistant:

~QGlobalNetworkProxy()
    {
        delete applicationLevelProxy;
        delete applicationLevelProxyFactory;
#if QT_CONFIG(socks5)
        delete socks5SocketEngineHandler;
#endif
#if QT_CONFIG(http)
        delete httpSocketEngineHandler;
#endif
    }